

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  LogMessage *other_00;
  void **our_elems;
  int iVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (other == this) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x3b1);
    other_00 = LogMessage::operator<<(&local_58,"CHECK failed: (&other) != (this): ");
    LogFinisher::operator=(&local_59,other_00);
    LogMessage::~LogMessage(&local_58);
  }
  iVar2 = other->current_size_;
  if (iVar2 != 0) {
    pRVar1 = other->rep_;
    our_elems = InternalExtend(this,iVar2);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
              (this,our_elems,pRVar1->elements,iVar2,
               this->rep_->allocated_size - this->current_size_);
    iVar2 = iVar2 + this->current_size_;
    this->current_size_ = iVar2;
    if (this->rep_->allocated_size < iVar2) {
      this->rep_->allocated_size = iVar2;
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}